

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_loopfilter_sse2.c
# Opt level: O3

void aom_highbd_lpf_horizontal_8_sse2
               (uint16_t *s,int p,uint8_t *_blimit,uint8_t *_limit,uint8_t *_thresh,int bd)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  short sVar6;
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [16];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  long lVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  short sVar40;
  short sVar41;
  undefined4 uVar42;
  short sVar45;
  short sVar46;
  short sVar47;
  short sVar48;
  short sVar49;
  short sVar50;
  short sVar51;
  short sVar52;
  short sVar53;
  short sVar54;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined8 uVar55;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  short sVar59;
  short sVar60;
  short sVar61;
  short sVar62;
  short sVar64;
  short sVar65;
  short sVar66;
  undefined1 auVar63 [16];
  undefined4 uVar67;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  short sVar75;
  short sVar77;
  short sVar78;
  short sVar79;
  undefined1 auVar76 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  ushort uVar84;
  ushort uVar86;
  ushort uVar87;
  ushort uVar88;
  ushort uVar89;
  ushort uVar90;
  ushort uVar91;
  undefined1 auVar85 [16];
  ushort uVar92;
  short sVar93;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  short sVar97;
  undefined1 auVar96 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  ushort uVar106;
  ushort uVar110;
  ushort uVar111;
  ushort uVar112;
  ushort uVar113;
  ushort uVar114;
  ushort uVar115;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  ushort uVar116;
  undefined1 auVar109 [16];
  __m128i pq [4];
  short local_e8;
  short sStack_e6;
  short sStack_e4;
  short sStack_e2;
  short local_d8;
  short sStack_d6;
  short sStack_d4;
  short sStack_d2;
  short local_c8;
  short sStack_c6;
  short sStack_c4;
  short sStack_c2;
  short local_b8;
  short sStack_b6;
  short sStack_b4;
  short sStack_b2;
  short local_a8;
  short sStack_a6;
  short sStack_a4;
  short sStack_a2;
  short local_98;
  short sStack_96;
  short sStack_94;
  short sStack_92;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 uVar68;
  
  uVar1 = *(undefined8 *)(s + -(long)(p * 4));
  lVar36 = (long)(p * 3);
  uVar55 = *(undefined8 *)(s + -lVar36);
  lVar39 = (long)(p * 2);
  uVar2 = *(undefined8 *)(s + -lVar39);
  lVar37 = (long)p;
  uVar3 = *(undefined8 *)(s + -lVar37);
  uVar4 = *(undefined8 *)(s + lVar37);
  uStack_30 = *(undefined8 *)(s + lVar39);
  uStack_20 = *(undefined8 *)(s + lVar36);
  uVar5 = *(undefined8 *)s;
  auVar98._8_8_ = uVar5;
  auVar98._0_8_ = *(undefined8 *)(s + -lVar37);
  auVar95._8_8_ = *(undefined8 *)(s + -lVar39);
  auVar95._0_8_ = *(undefined8 *)(s + -lVar37);
  local_48._8_8_ = uVar4;
  local_48._0_8_ = *(undefined8 *)(s + -lVar39);
  local_38 = *(undefined8 *)(s + -lVar36);
  local_28 = *(undefined8 *)(s + -(long)(p * 4));
  auVar69 = *(undefined1 (*) [16])_blimit;
  auVar9[0xd] = 0;
  auVar9._0_13_ = auVar69._0_13_;
  auVar9[0xe] = auVar69[7];
  auVar12[0xc] = auVar69[6];
  auVar12._0_12_ = auVar69._0_12_;
  auVar12._13_2_ = auVar9._13_2_;
  auVar15[0xb] = 0;
  auVar15._0_11_ = auVar69._0_11_;
  auVar15._12_3_ = auVar12._12_3_;
  auVar18[10] = auVar69[5];
  auVar18._0_10_ = auVar69._0_10_;
  auVar18._11_4_ = auVar15._11_4_;
  auVar21[9] = 0;
  auVar21._0_9_ = auVar69._0_9_;
  auVar21._10_5_ = auVar18._10_5_;
  auVar24[8] = auVar69[4];
  auVar24._0_8_ = auVar69._0_8_;
  auVar24._9_6_ = auVar21._9_6_;
  auVar27._7_8_ = 0;
  auVar27._0_7_ = auVar24._8_7_;
  auVar30._1_8_ = SUB158(auVar27 << 0x40,7);
  auVar30[0] = auVar69[3];
  auVar30._9_6_ = 0;
  auVar31._1_10_ = SUB1510(auVar30 << 0x30,5);
  auVar31[0] = auVar69[2];
  auVar31._11_4_ = 0;
  auVar70._3_12_ = SUB1512(auVar31 << 0x20,3);
  auVar70[2] = auVar69[1];
  auVar70[0] = auVar69[0];
  auVar70[1] = 0;
  auVar70[0xf] = 0;
  auVar69 = *(undefined1 (*) [16])_limit;
  auVar7[0xd] = 0;
  auVar7._0_13_ = auVar69._0_13_;
  auVar7[0xe] = auVar69[7];
  auVar10[0xc] = auVar69[6];
  auVar10._0_12_ = auVar69._0_12_;
  auVar10._13_2_ = auVar7._13_2_;
  auVar13[0xb] = 0;
  auVar13._0_11_ = auVar69._0_11_;
  auVar13._12_3_ = auVar10._12_3_;
  auVar16[10] = auVar69[5];
  auVar16._0_10_ = auVar69._0_10_;
  auVar16._11_4_ = auVar13._11_4_;
  auVar19[9] = 0;
  auVar19._0_9_ = auVar69._0_9_;
  auVar19._10_5_ = auVar16._10_5_;
  auVar22[8] = auVar69[4];
  auVar22._0_8_ = auVar69._0_8_;
  auVar22._9_6_ = auVar19._9_6_;
  auVar28._7_8_ = 0;
  auVar28._0_7_ = auVar22._8_7_;
  auVar32._1_8_ = SUB158(auVar28 << 0x40,7);
  auVar32[0] = auVar69[3];
  auVar32._9_6_ = 0;
  auVar33._1_10_ = SUB1510(auVar32 << 0x30,5);
  auVar33[0] = auVar69[2];
  auVar33._11_4_ = 0;
  auVar25[2] = auVar69[1];
  auVar25._0_2_ = auVar69._0_2_;
  auVar25._3_12_ = SUB1512(auVar33 << 0x20,3);
  auVar85._0_2_ = auVar69._0_2_ & 0xff;
  auVar85._2_13_ = auVar25._2_13_;
  auVar85[0xf] = 0;
  auVar69 = *(undefined1 (*) [16])_thresh;
  auVar8[0xd] = 0;
  auVar8._0_13_ = auVar69._0_13_;
  auVar8[0xe] = auVar69[7];
  auVar11[0xc] = auVar69[6];
  auVar11._0_12_ = auVar69._0_12_;
  auVar11._13_2_ = auVar8._13_2_;
  auVar14[0xb] = 0;
  auVar14._0_11_ = auVar69._0_11_;
  auVar14._12_3_ = auVar11._12_3_;
  auVar17[10] = auVar69[5];
  auVar17._0_10_ = auVar69._0_10_;
  auVar17._11_4_ = auVar14._11_4_;
  auVar20[9] = 0;
  auVar20._0_9_ = auVar69._0_9_;
  auVar20._10_5_ = auVar17._10_5_;
  auVar23[8] = auVar69[4];
  auVar23._0_8_ = auVar69._0_8_;
  auVar23._9_6_ = auVar20._9_6_;
  auVar29._7_8_ = 0;
  auVar29._0_7_ = auVar23._8_7_;
  auVar34._1_8_ = SUB158(auVar29 << 0x40,7);
  auVar34[0] = auVar69[3];
  auVar34._9_6_ = 0;
  auVar35._1_10_ = SUB1510(auVar34 << 0x30,5);
  auVar35[0] = auVar69[2];
  auVar35._11_4_ = 0;
  auVar56._3_12_ = SUB1512(auVar35 << 0x20,3);
  auVar56[2] = auVar69[1];
  auVar56[0] = auVar69[0];
  auVar56[1] = 0;
  auVar56[0xf] = 0;
  auVar94._8_4_ = (int)uVar4;
  auVar94._0_8_ = uVar5;
  auVar94._12_4_ = (int)((ulong)uVar4 >> 0x20);
  auVar69 = psubusw(auVar95,auVar94);
  auVar80 = psubusw(auVar94,auVar95);
  auVar80 = auVar80 | auVar69;
  auVar99 = ZEXT416(bd - 8);
  auVar69 = psllw(auVar70,auVar99);
  auVar70 = paddusw(auVar80,auVar80);
  auVar71._0_8_ = auVar70._0_8_;
  auVar71._8_8_ = 0;
  auVar81._0_2_ = auVar80._8_2_ >> 1;
  auVar81._2_2_ = auVar80._10_2_ >> 1;
  auVar81._4_2_ = auVar80._12_2_ >> 1;
  auVar81._6_2_ = auVar80._14_2_ >> 1;
  auVar81._8_8_ = 0;
  auVar70 = paddusw(auVar81,auVar71);
  auVar70 = auVar70 ^ _DAT_00beb230;
  auVar69 = auVar69 ^ _DAT_00beb230;
  auVar82._0_2_ = -(ushort)(auVar69._0_2_ < auVar70._0_2_);
  auVar82._2_2_ = -(ushort)(auVar69._2_2_ < auVar70._2_2_);
  auVar82._4_2_ = -(ushort)(auVar69._4_2_ < auVar70._4_2_);
  auVar82._6_2_ = -(ushort)(auVar69._6_2_ < auVar70._6_2_);
  auVar82._8_2_ = -(ushort)(auVar69._8_2_ < auVar70._8_2_);
  auVar82._10_2_ = -(ushort)(auVar69._10_2_ < auVar70._10_2_);
  auVar82._12_2_ = -(ushort)(auVar69._12_2_ < auVar70._12_2_);
  auVar82._14_2_ = -(ushort)(auVar69._14_2_ < auVar70._14_2_);
  auVar70 = psllw(auVar85,auVar99);
  auVar85 = paddusw(_DAT_00beb0f0,auVar70);
  auVar85 = auVar85 & auVar82;
  auVar69 = psubusw(auVar98,local_48);
  auVar71 = psubusw(local_48,auVar98);
  auVar71 = auVar71 | auVar69;
  auVar69 = psllw(auVar56,auVar99);
  sVar47 = auVar71._0_2_;
  sVar52 = auVar71._8_2_;
  auVar80._0_2_ = (ushort)(sVar52 < sVar47) * sVar47 | (ushort)(sVar52 >= sVar47) * sVar52;
  sVar49 = auVar71._2_2_;
  sVar51 = auVar71._10_2_;
  auVar80._2_2_ = (ushort)(sVar51 < sVar49) * sVar49 | (ushort)(sVar51 >= sVar49) * sVar51;
  sVar48 = auVar71._4_2_;
  sVar53 = auVar71._12_2_;
  auVar80._4_2_ = (ushort)(sVar53 < sVar48) * sVar48 | (ushort)(sVar53 >= sVar48) * sVar53;
  sVar50 = auVar71._6_2_;
  sVar54 = auVar71._14_2_;
  auVar80._6_2_ = (ushort)(sVar54 < sVar50) * sVar50 | (ushort)(sVar54 >= sVar50) * sVar54;
  sVar45 = (ushort)(0 < sVar52) * sVar52;
  auVar80._8_2_ = sVar45;
  sVar40 = (ushort)(0 < sVar51) * sVar51;
  auVar80._10_2_ = sVar40;
  sVar41 = (ushort)(0 < sVar53) * sVar53;
  auVar80._12_2_ = sVar41;
  sVar46 = (ushort)(0 < sVar54) * sVar54;
  auVar80._14_2_ = sVar46;
  sVar59 = auVar85._0_2_;
  uVar84 = (sVar59 < (short)auVar80._0_2_) * auVar80._0_2_ |
           (ushort)(sVar59 >= (short)auVar80._0_2_) * sVar59;
  sVar59 = auVar85._2_2_;
  uVar86 = (sVar59 < (short)auVar80._2_2_) * auVar80._2_2_ |
           (ushort)(sVar59 >= (short)auVar80._2_2_) * sVar59;
  sVar59 = auVar85._4_2_;
  uVar87 = (sVar59 < (short)auVar80._4_2_) * auVar80._4_2_ |
           (ushort)(sVar59 >= (short)auVar80._4_2_) * sVar59;
  sVar59 = auVar85._6_2_;
  uVar88 = (sVar59 < (short)auVar80._6_2_) * auVar80._6_2_ |
           (ushort)(sVar59 >= (short)auVar80._6_2_) * sVar59;
  sVar59 = auVar85._8_2_;
  uVar89 = (ushort)(sVar59 < sVar45) * sVar45 | (ushort)(sVar59 >= sVar45) * sVar59;
  sVar45 = auVar85._10_2_;
  uVar90 = (ushort)(sVar45 < sVar40) * sVar40 | (ushort)(sVar45 >= sVar40) * sVar45;
  sVar40 = auVar85._12_2_;
  sVar45 = auVar85._14_2_;
  uVar91 = (ushort)(sVar40 < sVar41) * sVar41 | (ushort)(sVar40 >= sVar41) * sVar40;
  uVar92 = (ushort)(sVar45 < sVar46) * sVar46 | (ushort)(sVar45 >= sVar46) * sVar45;
  auVar80 = auVar80 ^ _DAT_00beb230;
  auVar69 = auVar69 ^ _DAT_00beb230;
  uVar67 = CONCAT22(-(ushort)(auVar69._2_2_ < auVar80._2_2_),
                    -(ushort)(auVar69._0_2_ < auVar80._0_2_));
  uVar68 = CONCAT26(-(ushort)(auVar69._6_2_ < auVar80._6_2_),
                    CONCAT24(-(ushort)(auVar69._4_2_ < auVar80._4_2_),uVar67));
  lVar38 = 0x20;
  auVar69 = ZEXT416((uint)(1 << ((char)bd - 1U & 0x1f)));
  do {
    auVar85 = psubusw(*(undefined1 (*) [16])(local_58 + lVar38),
                      *(undefined1 (*) [16])(local_68 + lVar38));
    auVar56 = psubusw(*(undefined1 (*) [16])(local_68 + lVar38),
                      *(undefined1 (*) [16])(local_58 + lVar38));
    auVar56 = auVar56 | auVar85;
    sVar40 = auVar56._0_2_;
    uVar84 = (ushort)((short)uVar84 < sVar40) * sVar40 | ((short)uVar84 >= sVar40) * uVar84;
    sVar40 = auVar56._2_2_;
    uVar86 = (ushort)((short)uVar86 < sVar40) * sVar40 | ((short)uVar86 >= sVar40) * uVar86;
    sVar40 = auVar56._4_2_;
    uVar87 = (ushort)((short)uVar87 < sVar40) * sVar40 | ((short)uVar87 >= sVar40) * uVar87;
    sVar40 = auVar56._6_2_;
    uVar88 = (ushort)((short)uVar88 < sVar40) * sVar40 | ((short)uVar88 >= sVar40) * uVar88;
    sVar40 = auVar56._8_2_;
    uVar89 = (ushort)((short)uVar89 < sVar40) * sVar40 | ((short)uVar89 >= sVar40) * uVar89;
    sVar40 = auVar56._10_2_;
    uVar90 = (ushort)((short)uVar90 < sVar40) * sVar40 | ((short)uVar90 >= sVar40) * uVar90;
    sVar40 = auVar56._12_2_;
    uVar91 = (ushort)((short)uVar91 < sVar40) * sVar40 | ((short)uVar91 >= sVar40) * uVar91;
    sVar40 = auVar56._14_2_;
    uVar92 = (ushort)((short)uVar92 < sVar40) * sVar40 | ((short)uVar92 >= sVar40) * uVar92;
    lVar38 = lVar38 + 0x10;
  } while (lVar38 != 0x40);
  auVar69 = pshuflw(auVar69,auVar69,0);
  uVar42 = auVar69._0_4_;
  auVar57._4_4_ = uVar42;
  auVar57._0_4_ = uVar42;
  auVar57._8_4_ = uVar42;
  auVar57._12_4_ = uVar42;
  auVar43._8_4_ = uVar67;
  auVar43._0_8_ = uVar68;
  auVar43._12_4_ = (int)((ulong)uVar68 >> 0x20);
  auVar72._0_2_ =
       ((short)uVar89 < (short)uVar84) * uVar84 | ((short)uVar89 >= (short)uVar84) * uVar89;
  auVar72._2_2_ =
       ((short)uVar90 < (short)uVar86) * uVar86 | ((short)uVar90 >= (short)uVar86) * uVar90;
  auVar72._4_2_ =
       ((short)uVar91 < (short)uVar87) * uVar87 | ((short)uVar91 >= (short)uVar87) * uVar91;
  auVar72._6_2_ =
       ((short)uVar92 < (short)uVar88) * uVar88 | ((short)uVar92 >= (short)uVar88) * uVar92;
  auVar72._8_2_ = (0 < (short)uVar89) * uVar89;
  auVar72._10_2_ = (0 < (short)uVar90) * uVar90;
  auVar72._12_2_ = (0 < (short)uVar91) * uVar91;
  auVar72._14_2_ = (0 < (short)uVar92) * uVar92;
  auVar69 = psubusw(auVar72,auVar70);
  auVar73._0_2_ = -(ushort)(auVar69._0_2_ == 0);
  auVar73._2_2_ = -(ushort)(auVar69._2_2_ == 0);
  auVar73._4_2_ = -(ushort)(auVar69._4_2_ == 0);
  auVar73._6_2_ = -(ushort)(auVar69._6_2_ == 0);
  auVar73._8_2_ = -(ushort)(auVar69._8_2_ == 0);
  auVar73._10_2_ = -(ushort)(auVar69._10_2_ == 0);
  auVar73._12_2_ = -(ushort)(auVar69._12_2_ == 0);
  auVar73._14_2_ = -(ushort)(auVar69._14_2_ == 0);
  auVar69 = psllw(_DAT_00beb0f0,ZEXT416((uint)bd));
  auVar107._8_4_ = 0xffffffff;
  auVar107._0_8_ = 0xffffffffffffffff;
  auVar107._12_4_ = 0xffffffff;
  auVar69 = paddsw(auVar69,auVar107);
  auVar56 = psubsw(auVar69,auVar57);
  auVar70 = psubsw((undefined1  [16])0x0,auVar57);
  auVar69 = psubsw(auVar95,auVar57);
  auVar95 = psubsw(auVar94,auVar57);
  auVar85 = psubsw(auVar69,auVar95);
  sVar64 = auVar56._0_2_;
  sVar40 = auVar85._0_2_;
  uVar84 = (ushort)(sVar64 < sVar40) * sVar64 | (ushort)(sVar64 >= sVar40) * sVar40;
  sVar65 = auVar56._2_2_;
  sVar40 = auVar85._2_2_;
  uVar86 = (ushort)(sVar65 < sVar40) * sVar65 | (ushort)(sVar65 >= sVar40) * sVar40;
  sVar66 = auVar56._4_2_;
  sVar40 = auVar85._4_2_;
  uVar87 = (ushort)(sVar66 < sVar40) * sVar66 | (ushort)(sVar66 >= sVar40) * sVar40;
  sVar75 = auVar56._6_2_;
  sVar40 = auVar85._6_2_;
  uVar88 = (ushort)(sVar75 < sVar40) * sVar75 | (ushort)(sVar75 >= sVar40) * sVar40;
  sVar77 = auVar56._8_2_;
  sVar40 = auVar85._8_2_;
  uVar89 = (ushort)(sVar77 < sVar40) * sVar77 | (ushort)(sVar77 >= sVar40) * sVar40;
  sVar78 = auVar56._10_2_;
  sVar40 = auVar85._10_2_;
  uVar90 = (ushort)(sVar78 < sVar40) * sVar78 | (ushort)(sVar78 >= sVar40) * sVar40;
  sVar79 = auVar56._12_2_;
  sVar40 = auVar85._12_2_;
  sVar41 = auVar85._14_2_;
  uVar91 = (ushort)(sVar79 < sVar40) * sVar79 | (ushort)(sVar79 >= sVar40) * sVar40;
  sVar6 = auVar56._14_2_;
  uVar92 = (ushort)(sVar6 < sVar41) * sVar6 | (ushort)(sVar6 >= sVar41) * sVar41;
  sVar40 = auVar70._0_2_;
  auVar104._0_2_ = (ushort)((short)uVar84 < sVar40) * sVar40 | ((short)uVar84 >= sVar40) * uVar84;
  sVar41 = auVar70._2_2_;
  auVar104._2_2_ = (ushort)((short)uVar86 < sVar41) * sVar41 | ((short)uVar86 >= sVar41) * uVar86;
  sVar46 = auVar70._4_2_;
  auVar104._4_2_ = (ushort)((short)uVar87 < sVar46) * sVar46 | ((short)uVar87 >= sVar46) * uVar87;
  sVar45 = auVar70._6_2_;
  auVar104._6_2_ = (ushort)((short)uVar88 < sVar45) * sVar45 | ((short)uVar88 >= sVar45) * uVar88;
  sVar59 = auVar70._8_2_;
  auVar104._8_2_ = (ushort)((short)uVar89 < sVar59) * sVar59 | ((short)uVar89 >= sVar59) * uVar89;
  sVar60 = auVar70._10_2_;
  auVar104._10_2_ = (ushort)((short)uVar90 < sVar60) * sVar60 | ((short)uVar90 >= sVar60) * uVar90;
  sVar61 = auVar70._12_2_;
  auVar104._12_2_ = (ushort)((short)uVar91 < sVar61) * sVar61 | ((short)uVar91 >= sVar61) * uVar91;
  sVar62 = auVar70._14_2_;
  auVar104._14_2_ = (ushort)((short)uVar92 < sVar62) * sVar62 | ((short)uVar92 >= sVar62) * uVar92;
  auVar56 = psubsw(auVar104 >> 0x40 & auVar43,auVar104);
  auVar56 = psubsw(auVar56,auVar104);
  auVar56 = psubsw(auVar56,auVar104);
  sVar93 = auVar56._0_2_;
  uVar84 = (ushort)(sVar64 < sVar93) * sVar64 | (ushort)(sVar64 >= sVar93) * sVar93;
  sVar93 = auVar56._2_2_;
  uVar86 = (ushort)(sVar65 < sVar93) * sVar65 | (ushort)(sVar65 >= sVar93) * sVar93;
  sVar93 = auVar56._4_2_;
  uVar87 = (ushort)(sVar66 < sVar93) * sVar66 | (ushort)(sVar66 >= sVar93) * sVar93;
  sVar93 = auVar56._6_2_;
  uVar88 = (ushort)(sVar75 < sVar93) * sVar75 | (ushort)(sVar75 >= sVar93) * sVar93;
  sVar93 = auVar56._8_2_;
  uVar89 = (ushort)(sVar77 < sVar93) * sVar77 | (ushort)(sVar77 >= sVar93) * sVar93;
  sVar93 = auVar56._10_2_;
  uVar90 = (ushort)(sVar78 < sVar93) * sVar78 | (ushort)(sVar78 >= sVar93) * sVar93;
  sVar93 = auVar56._12_2_;
  sVar97 = auVar56._14_2_;
  uVar91 = (ushort)(sVar79 < sVar93) * sVar79 | (ushort)(sVar79 >= sVar93) * sVar93;
  uVar92 = (ushort)(sVar6 < sVar97) * sVar6 | (ushort)(sVar6 >= sVar97) * sVar97;
  auVar100._0_2_ = (ushort)((short)uVar84 < sVar40) * sVar40 | ((short)uVar84 >= sVar40) * uVar84;
  auVar100._2_2_ = (ushort)((short)uVar86 < sVar41) * sVar41 | ((short)uVar86 >= sVar41) * uVar86;
  auVar100._4_2_ = (ushort)((short)uVar87 < sVar46) * sVar46 | ((short)uVar87 >= sVar46) * uVar87;
  auVar100._6_2_ = (ushort)((short)uVar88 < sVar45) * sVar45 | ((short)uVar88 >= sVar45) * uVar88;
  auVar100._8_2_ = (ushort)((short)uVar89 < sVar59) * sVar59 | ((short)uVar89 >= sVar59) * uVar89;
  auVar100._10_2_ = (ushort)((short)uVar90 < sVar60) * sVar60 | ((short)uVar90 >= sVar60) * uVar90;
  auVar100._12_2_ = (ushort)((short)uVar91 < sVar61) * sVar61 | ((short)uVar91 >= sVar61) * uVar91;
  auVar100._14_2_ = (ushort)((short)uVar92 < sVar62) * sVar62 | ((short)uVar92 >= sVar62) * uVar92;
  auVar100 = auVar100 & auVar73;
  auVar101._0_8_ = auVar100._0_8_;
  auVar101._8_4_ = auVar100._0_4_;
  auVar101._12_4_ = auVar100._4_4_;
  auVar56 = paddsw(auVar101,_DAT_00d129c0);
  sVar93 = auVar56._0_2_;
  uVar84 = (ushort)(sVar64 < sVar93) * sVar64 | (ushort)(sVar64 >= sVar93) * sVar93;
  sVar93 = auVar56._2_2_;
  uVar86 = (ushort)(sVar65 < sVar93) * sVar65 | (ushort)(sVar65 >= sVar93) * sVar93;
  sVar93 = auVar56._4_2_;
  uVar87 = (ushort)(sVar66 < sVar93) * sVar66 | (ushort)(sVar66 >= sVar93) * sVar93;
  sVar93 = auVar56._6_2_;
  uVar88 = (ushort)(sVar75 < sVar93) * sVar75 | (ushort)(sVar75 >= sVar93) * sVar93;
  sVar93 = auVar56._8_2_;
  uVar89 = (ushort)(sVar77 < sVar93) * sVar77 | (ushort)(sVar77 >= sVar93) * sVar93;
  sVar93 = auVar56._10_2_;
  uVar90 = (ushort)(sVar78 < sVar93) * sVar78 | (ushort)(sVar78 >= sVar93) * sVar93;
  sVar93 = auVar56._12_2_;
  sVar97 = auVar56._14_2_;
  uVar91 = (ushort)(sVar79 < sVar93) * sVar79 | (ushort)(sVar79 >= sVar93) * sVar93;
  uVar92 = (ushort)(sVar6 < sVar97) * sVar6 | (ushort)(sVar6 >= sVar97) * sVar97;
  auVar102._0_2_ = (ushort)((short)uVar84 < sVar40) * sVar40 | ((short)uVar84 >= sVar40) * uVar84;
  auVar102._2_2_ = (ushort)((short)uVar86 < sVar41) * sVar41 | ((short)uVar86 >= sVar41) * uVar86;
  auVar102._4_2_ = (ushort)((short)uVar87 < sVar46) * sVar46 | ((short)uVar87 >= sVar46) * uVar87;
  auVar102._6_2_ = (ushort)((short)uVar88 < sVar45) * sVar45 | ((short)uVar88 >= sVar45) * uVar88;
  auVar102._8_2_ = (ushort)((short)uVar89 < sVar59) * sVar59 | ((short)uVar89 >= sVar59) * uVar89;
  auVar102._10_2_ = (ushort)((short)uVar90 < sVar60) * sVar60 | ((short)uVar90 >= sVar60) * uVar90;
  auVar102._12_2_ = (ushort)((short)uVar91 < sVar61) * sVar61 | ((short)uVar91 >= sVar61) * uVar91;
  auVar102._14_2_ = (ushort)((short)uVar92 < sVar62) * sVar62 | ((short)uVar92 >= sVar62) * uVar92;
  auVar56 = psraw(auVar102,3);
  auVar105._0_2_ = auVar56._0_2_ + 1;
  auVar105._2_2_ = auVar56._2_2_ + 1;
  auVar105._4_2_ = auVar56._4_2_ + 1;
  auVar105._6_2_ = auVar56._6_2_ + 1;
  auVar105._8_2_ = auVar56._0_2_ + 1;
  auVar105._10_2_ = auVar56._2_2_ + 1;
  auVar105._12_2_ = auVar56._4_2_ + 1;
  auVar105._14_2_ = auVar56._6_2_ + 1;
  auVar70 = psraw(auVar105,1);
  auVar108._8_8_ = SUB168(~auVar43 & auVar70,8);
  auVar108._0_8_ = auVar56._8_8_;
  auVar103._8_8_ = SUB168(~auVar43 & auVar70,0);
  auVar103._0_8_ = auVar56._0_8_;
  auVar56 = psubsw(auVar95,auVar103);
  auVar69 = paddsw(auVar108,auVar69);
  sVar93 = auVar56._0_2_;
  uVar84 = (ushort)(sVar64 < sVar93) * sVar64 | (ushort)(sVar64 >= sVar93) * sVar93;
  sVar93 = auVar56._2_2_;
  uVar86 = (ushort)(sVar65 < sVar93) * sVar65 | (ushort)(sVar65 >= sVar93) * sVar93;
  sVar93 = auVar56._4_2_;
  uVar87 = (ushort)(sVar66 < sVar93) * sVar66 | (ushort)(sVar66 >= sVar93) * sVar93;
  sVar93 = auVar56._6_2_;
  uVar88 = (ushort)(sVar75 < sVar93) * sVar75 | (ushort)(sVar75 >= sVar93) * sVar93;
  sVar93 = auVar56._8_2_;
  uVar89 = (ushort)(sVar77 < sVar93) * sVar77 | (ushort)(sVar77 >= sVar93) * sVar93;
  sVar93 = auVar56._10_2_;
  uVar90 = (ushort)(sVar78 < sVar93) * sVar78 | (ushort)(sVar78 >= sVar93) * sVar93;
  sVar93 = auVar56._12_2_;
  sVar97 = auVar56._14_2_;
  uVar91 = (ushort)(sVar79 < sVar93) * sVar79 | (ushort)(sVar79 >= sVar93) * sVar93;
  uVar92 = (ushort)(sVar6 < sVar97) * sVar6 | (ushort)(sVar6 >= sVar97) * sVar97;
  sVar93 = auVar69._0_2_;
  uVar106 = (ushort)(sVar64 < sVar93) * sVar64 | (ushort)(sVar64 >= sVar93) * sVar93;
  sVar64 = auVar69._2_2_;
  uVar110 = (ushort)(sVar65 < sVar64) * sVar65 | (ushort)(sVar65 >= sVar64) * sVar64;
  sVar64 = auVar69._4_2_;
  uVar111 = (ushort)(sVar66 < sVar64) * sVar66 | (ushort)(sVar66 >= sVar64) * sVar64;
  sVar64 = auVar69._6_2_;
  uVar112 = (ushort)(sVar75 < sVar64) * sVar75 | (ushort)(sVar75 >= sVar64) * sVar64;
  sVar64 = auVar69._8_2_;
  uVar113 = (ushort)(sVar77 < sVar64) * sVar77 | (ushort)(sVar77 >= sVar64) * sVar64;
  sVar64 = auVar69._10_2_;
  uVar114 = (ushort)(sVar78 < sVar64) * sVar78 | (ushort)(sVar78 >= sVar64) * sVar64;
  sVar64 = auVar69._12_2_;
  sVar65 = auVar69._14_2_;
  uVar115 = (ushort)(sVar79 < sVar64) * sVar79 | (ushort)(sVar79 >= sVar64) * sVar64;
  uVar116 = (ushort)(sVar6 < sVar65) * sVar6 | (ushort)(sVar6 >= sVar65) * sVar65;
  auVar96._0_2_ = (ushort)((short)uVar84 < sVar40) * sVar40 | ((short)uVar84 >= sVar40) * uVar84;
  auVar96._2_2_ = (ushort)((short)uVar86 < sVar41) * sVar41 | ((short)uVar86 >= sVar41) * uVar86;
  auVar96._4_2_ = (ushort)((short)uVar87 < sVar46) * sVar46 | ((short)uVar87 >= sVar46) * uVar87;
  auVar96._6_2_ = (ushort)((short)uVar88 < sVar45) * sVar45 | ((short)uVar88 >= sVar45) * uVar88;
  auVar96._8_2_ = (ushort)((short)uVar89 < sVar59) * sVar59 | ((short)uVar89 >= sVar59) * uVar89;
  auVar96._10_2_ = (ushort)((short)uVar90 < sVar60) * sVar60 | ((short)uVar90 >= sVar60) * uVar90;
  auVar96._12_2_ = (ushort)((short)uVar91 < sVar61) * sVar61 | ((short)uVar91 >= sVar61) * uVar91;
  auVar96._14_2_ = (ushort)((short)uVar92 < sVar62) * sVar62 | ((short)uVar92 >= sVar62) * uVar92;
  auVar109._0_2_ = (ushort)((short)uVar106 < sVar40) * sVar40 | ((short)uVar106 >= sVar40) * uVar106
  ;
  auVar109._2_2_ = (ushort)((short)uVar110 < sVar41) * sVar41 | ((short)uVar110 >= sVar41) * uVar110
  ;
  auVar109._4_2_ = (ushort)((short)uVar111 < sVar46) * sVar46 | ((short)uVar111 >= sVar46) * uVar111
  ;
  auVar109._6_2_ = (ushort)((short)uVar112 < sVar45) * sVar45 | ((short)uVar112 >= sVar45) * uVar112
  ;
  auVar109._8_2_ = (ushort)((short)uVar113 < sVar59) * sVar59 | ((short)uVar113 >= sVar59) * uVar113
  ;
  auVar109._10_2_ =
       (ushort)((short)uVar114 < sVar60) * sVar60 | ((short)uVar114 >= sVar60) * uVar114;
  auVar109._12_2_ =
       (ushort)((short)uVar115 < sVar61) * sVar61 | ((short)uVar115 >= sVar61) * uVar115;
  auVar109._14_2_ =
       (ushort)((short)uVar116 < sVar62) * sVar62 | ((short)uVar116 >= sVar62) * uVar116;
  auVar70 = paddsw(auVar96,auVar57);
  auVar85 = paddsw(auVar109,auVar57);
  auVar26._8_8_ = uStack_30;
  auVar26._0_8_ = *(undefined8 *)(s + -lVar36);
  auVar69 = psubusw(auVar26,auVar98);
  auVar95 = psubusw(auVar98,auVar26);
  auVar95 = auVar95 | auVar69;
  auVar69._8_8_ = uStack_20;
  auVar69._0_8_ = *(undefined8 *)(s + -(long)(p * 4));
  auVar56 = psubusw(auVar69,auVar98);
  auVar69 = psubusw(auVar98,auVar69);
  auVar69 = auVar69 | auVar56;
  sVar40 = auVar95._0_2_;
  sVar41 = auVar69._0_2_;
  uVar84 = (ushort)(sVar41 < sVar40) * sVar40 | (ushort)(sVar41 >= sVar40) * sVar41;
  sVar40 = auVar95._2_2_;
  sVar41 = auVar69._2_2_;
  uVar86 = (ushort)(sVar41 < sVar40) * sVar40 | (ushort)(sVar41 >= sVar40) * sVar41;
  sVar40 = auVar95._4_2_;
  sVar41 = auVar69._4_2_;
  uVar87 = (ushort)(sVar41 < sVar40) * sVar40 | (ushort)(sVar41 >= sVar40) * sVar41;
  sVar40 = auVar95._6_2_;
  sVar41 = auVar69._6_2_;
  uVar88 = (ushort)(sVar41 < sVar40) * sVar40 | (ushort)(sVar41 >= sVar40) * sVar41;
  sVar40 = auVar95._8_2_;
  sVar41 = auVar69._8_2_;
  uVar89 = (ushort)(sVar41 < sVar40) * sVar40 | (ushort)(sVar41 >= sVar40) * sVar41;
  sVar40 = auVar95._10_2_;
  sVar41 = auVar69._10_2_;
  uVar90 = (ushort)(sVar41 < sVar40) * sVar40 | (ushort)(sVar41 >= sVar40) * sVar41;
  sVar40 = auVar95._12_2_;
  sVar41 = auVar69._12_2_;
  sVar46 = auVar69._14_2_;
  uVar91 = (ushort)(sVar41 < sVar40) * sVar40 | (ushort)(sVar41 >= sVar40) * sVar41;
  sVar40 = auVar95._14_2_;
  uVar92 = (ushort)(sVar46 < sVar40) * sVar40 | (ushort)(sVar46 >= sVar40) * sVar46;
  uVar84 = (sVar47 < (short)uVar84) * uVar84 | (ushort)(sVar47 >= (short)uVar84) * sVar47;
  uVar86 = (sVar49 < (short)uVar86) * uVar86 | (ushort)(sVar49 >= (short)uVar86) * sVar49;
  uVar87 = (sVar48 < (short)uVar87) * uVar87 | (ushort)(sVar48 >= (short)uVar87) * sVar48;
  uVar88 = (sVar50 < (short)uVar88) * uVar88 | (ushort)(sVar50 >= (short)uVar88) * sVar50;
  uVar89 = (sVar52 < (short)uVar89) * uVar89 | (ushort)(sVar52 >= (short)uVar89) * sVar52;
  uVar90 = (sVar51 < (short)uVar90) * uVar90 | (ushort)(sVar51 >= (short)uVar90) * sVar51;
  uVar91 = (sVar53 < (short)uVar91) * uVar91 | (ushort)(sVar53 >= (short)uVar91) * sVar53;
  uVar92 = (sVar54 < (short)uVar92) * uVar92 | (ushort)(sVar54 >= (short)uVar92) * sVar54;
  auVar69 = psllw(_DAT_00beb0f0,auVar99);
  auVar99._0_2_ =
       ((short)uVar89 < (short)uVar84) * uVar84 | ((short)uVar89 >= (short)uVar84) * uVar89;
  auVar99._2_2_ =
       ((short)uVar90 < (short)uVar86) * uVar86 | ((short)uVar90 >= (short)uVar86) * uVar90;
  auVar99._4_2_ =
       ((short)uVar91 < (short)uVar87) * uVar87 | ((short)uVar91 >= (short)uVar87) * uVar91;
  auVar99._6_2_ =
       ((short)uVar92 < (short)uVar88) * uVar88 | ((short)uVar92 >= (short)uVar88) * uVar92;
  auVar99._8_2_ = (0 < (short)uVar89) * uVar89;
  auVar99._10_2_ = (0 < (short)uVar90) * uVar90;
  auVar99._12_2_ = (0 < (short)uVar91) * uVar91;
  auVar99._14_2_ = (0 < (short)uVar92) * uVar92;
  auVar69 = psubusw(auVar99,auVar69);
  auVar44._0_2_ = -(ushort)(auVar69._0_2_ == 0);
  auVar44._2_2_ = -(ushort)(auVar69._2_2_ == 0);
  auVar44._4_2_ = -(ushort)(auVar69._4_2_ == 0);
  auVar44._6_2_ = -(ushort)(auVar69._6_2_ == 0);
  auVar44._8_2_ = -(ushort)(auVar69._8_2_ == 0);
  auVar44._10_2_ = -(ushort)(auVar69._10_2_ == 0);
  auVar44._12_2_ = -(ushort)(auVar69._12_2_ == 0);
  auVar44._14_2_ = -(ushort)(auVar69._14_2_ == 0);
  auVar44 = auVar44 & auVar73;
  auVar74._0_8_ = auVar44._0_8_;
  auVar74._8_4_ = auVar44._0_4_;
  auVar74._12_4_ = auVar44._4_4_;
  auVar63._0_2_ = -(ushort)(auVar44._0_2_ == 0);
  auVar63._2_2_ = -(ushort)(auVar44._2_2_ == 0);
  auVar63._4_2_ = -(ushort)(auVar44._4_2_ == 0);
  auVar63._6_2_ = -(ushort)(auVar44._6_2_ == 0);
  auVar63._8_2_ = -(ushort)(auVar44._0_2_ == 0);
  auVar63._10_2_ = -(ushort)(auVar44._2_2_ == 0);
  auVar63._12_2_ = -(ushort)(auVar44._4_2_ == 0);
  auVar63._14_2_ = -(ushort)(auVar44._6_2_ == 0);
  if ((ushort)((ushort)(SUB161(auVar63 >> 7,0) & 1) | (ushort)(SUB161(auVar63 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar63 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar63 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar63 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar63 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar63 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar63 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar63 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar63 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar63 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar63 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar63 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar63 >> 0x6f,0) & 1) << 0xd |
               (ushort)((byte)(auVar63._14_2_ >> 7) & 1) << 0xe | auVar63._14_2_ & 0x8000) != 0xffff
     ) {
    local_a8 = (short)uVar1;
    sStack_a6 = (short)((ulong)uVar1 >> 0x10);
    sStack_a4 = (short)((ulong)uVar1 >> 0x20);
    sStack_a2 = (short)((ulong)uVar1 >> 0x30);
    local_e8 = (short)uVar55;
    sStack_e6 = (short)((ulong)uVar55 >> 0x10);
    sStack_e4 = (short)((ulong)uVar55 >> 0x20);
    sStack_e2 = (short)((ulong)uVar55 >> 0x30);
    local_b8 = (short)uVar2;
    sStack_b6 = (short)((ulong)uVar2 >> 0x10);
    sStack_b4 = (short)((ulong)uVar2 >> 0x20);
    sStack_b2 = (short)((ulong)uVar2 >> 0x30);
    local_98 = (short)uVar3;
    sStack_96 = (short)((ulong)uVar3 >> 0x10);
    sStack_94 = (short)((ulong)uVar3 >> 0x20);
    sStack_92 = (short)((ulong)uVar3 >> 0x30);
    sVar40 = local_a8 * 2 + local_e8 + local_b8 + local_98 + 4;
    sVar45 = sStack_a6 * 2 + sStack_e6 + sStack_b6 + sStack_96 + 4;
    sVar48 = sStack_a4 * 2 + sStack_e4 + sStack_b4 + sStack_94 + 4;
    sVar51 = sStack_a2 * 2 + sStack_e2 + sStack_b2 + sStack_92 + 4;
    sVar75 = (short)uVar5;
    sVar77 = (short)((ulong)uVar5 >> 0x10);
    sVar78 = (short)((ulong)uVar5 >> 0x20);
    sVar79 = (short)((ulong)uVar5 >> 0x30);
    local_c8 = (short)uVar4;
    sStack_c6 = (short)((ulong)uVar4 >> 0x10);
    sStack_c4 = (short)((ulong)uVar4 >> 0x20);
    sStack_c2 = (short)((ulong)uVar4 >> 0x30);
    sVar62 = sVar75 + local_c8;
    sVar64 = sVar77 + sStack_c6;
    sVar65 = sVar78 + sStack_c4;
    sVar66 = sVar79 + sStack_c2;
    sVar41 = (sVar40 - local_a8) + (short)uStack_30;
    sVar59 = (short)((ulong)uStack_30 >> 0x10);
    sVar46 = (sVar45 - sStack_a6) + sVar59;
    sVar60 = (short)((ulong)uStack_30 >> 0x20);
    sVar49 = (sVar48 - sStack_a4) + sVar60;
    sVar61 = (short)((ulong)uStack_30 >> 0x30);
    sVar52 = (sVar51 - sStack_a2) + sVar61;
    auVar83._0_2_ = (ushort)(local_98 + sVar62 + sVar41) >> 3;
    auVar83._2_2_ = (ushort)(sStack_96 + sVar64 + sVar46) >> 3;
    auVar83._4_2_ = (ushort)(sStack_94 + sVar65 + sVar49) >> 3;
    auVar83._6_2_ = (ushort)(sStack_92 + sVar66 + sVar52) >> 3;
    auVar83._8_2_ = (ushort)(sVar62 + local_b8 + sVar40) >> 3;
    auVar83._10_2_ = (ushort)(sVar64 + sStack_b6 + sVar45) >> 3;
    auVar83._12_2_ = (ushort)(sVar65 + sStack_b4 + sVar48) >> 3;
    auVar83._14_2_ = (ushort)(sVar66 + sStack_b2 + sVar51) >> 3;
    local_d8 = (short)uStack_20;
    sStack_d6 = (short)((ulong)uStack_20 >> 0x10);
    sStack_d4 = (short)((ulong)uStack_20 >> 0x20);
    sStack_d2 = (short)((ulong)uStack_20 >> 0x30);
    sVar41 = (sVar41 - local_a8) + local_d8;
    sVar47 = (sVar46 - sStack_a6) + sStack_d6;
    sVar50 = (sVar49 - sStack_a4) + sStack_d4;
    sVar53 = (sVar52 - sStack_a2) + sStack_d2;
    sVar46 = (sVar41 - local_e8) + local_d8;
    sVar49 = (sVar47 - sStack_e6) + sStack_d6;
    sVar52 = (sVar50 - sStack_e4) + sStack_d4;
    sVar54 = (sVar53 - sStack_e2) + sStack_d2;
    auVar76._0_2_ = (ushort)(sVar75 + sVar62 + sVar41) >> 3;
    auVar76._2_2_ = (ushort)(sVar77 + sVar64 + sVar47) >> 3;
    auVar76._4_2_ = (ushort)(sVar78 + sVar65 + sVar50) >> 3;
    auVar76._6_2_ = (ushort)(sVar79 + sVar66 + sVar53) >> 3;
    auVar76._8_2_ = (ushort)(local_c8 + sVar62 + sVar46) >> 3;
    auVar76._10_2_ = (ushort)(sStack_c6 + sVar64 + sVar49) >> 3;
    auVar76._12_2_ = (ushort)(sStack_c4 + sVar65 + sVar52) >> 3;
    auVar76._14_2_ = (ushort)(sStack_c2 + sVar66 + sVar54) >> 3;
    auVar58._0_2_ = (ushort)(local_e8 + local_a8 + sVar75 + sVar40) >> 3;
    auVar58._2_2_ = (ushort)(sStack_e6 + sStack_a6 + sVar77 + sVar45) >> 3;
    auVar58._4_2_ = (ushort)(sStack_e4 + sStack_a4 + sVar78 + sVar48) >> 3;
    auVar58._6_2_ = (ushort)(sStack_e2 + sStack_a2 + sVar79 + sVar51) >> 3;
    auVar58._8_2_ = (ushort)((((short)uStack_30 + local_d8) - local_b8) + sVar62 + sVar46) >> 3;
    auVar58._10_2_ = (ushort)(((sVar59 + sStack_d6) - sStack_b6) + sVar64 + sVar49) >> 3;
    auVar58._12_2_ = (ushort)(((sVar60 + sStack_d4) - sStack_b4) + sVar65 + sVar52) >> 3;
    auVar58._14_2_ = (ushort)(((sVar61 + sStack_d2) - sStack_b2) + sVar66 + sVar54) >> 3;
    auVar70 = auVar76 & auVar74 | ~auVar74 & auVar70;
    auVar85 = auVar83 & auVar74 | ~auVar74 & auVar85;
    auVar69 = auVar58 & auVar74 | ~auVar74 & auVar26;
    uVar55 = auVar69._0_8_;
    uStack_30 = auVar69._8_8_;
  }
  *(undefined8 *)(s + -lVar36) = uVar55;
  *(long *)(s + -lVar39) = auVar85._8_8_;
  *(long *)(s + -lVar37) = auVar85._0_8_;
  *(long *)s = auVar70._0_8_;
  *(long *)(s + lVar37) = auVar70._8_8_;
  *(undefined8 *)(s + lVar39) = uStack_30;
  return;
}

Assistant:

void aom_highbd_lpf_horizontal_8_sse2(uint16_t *s, int p,
                                      const uint8_t *_blimit,
                                      const uint8_t *_limit,
                                      const uint8_t *_thresh, int bd) {
  __m128i p2, p1, p0, q0, q1, q2, p3, q3;
  __m128i q1q0, p1p0;

  p3 = _mm_loadl_epi64((__m128i *)(s - 4 * p));
  q3 = _mm_loadl_epi64((__m128i *)(s + 3 * p));
  p2 = _mm_loadl_epi64((__m128i *)(s - 3 * p));
  q2 = _mm_loadl_epi64((__m128i *)(s + 2 * p));
  p1 = _mm_loadl_epi64((__m128i *)(s - 2 * p));
  q1 = _mm_loadl_epi64((__m128i *)(s + 1 * p));
  p0 = _mm_loadl_epi64((__m128i *)(s - 1 * p));
  q0 = _mm_loadl_epi64((__m128i *)(s + 0 * p));

  highbd_lpf_internal_8_sse2(&p3, &q3, &p2, &q2, &p1, &q1, &p0, &q0, &q1q0,
                             &p1p0, _blimit, _limit, _thresh, bd);

  _mm_storel_epi64((__m128i *)(s - 3 * p), p2);
  _mm_storel_epi64((__m128i *)(s - 2 * p), _mm_srli_si128(p1p0, 8));
  _mm_storel_epi64((__m128i *)(s - 1 * p), p1p0);
  _mm_storel_epi64((__m128i *)(s + 0 * p), q1q0);
  _mm_storel_epi64((__m128i *)(s + 1 * p), _mm_srli_si128(q1q0, 8));
  _mm_storel_epi64((__m128i *)(s + 2 * p), q2);
}